

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_parser.cpp
# Opt level: O3

void __thiscall
Importer_resolveUnitsImportFromFile_Test::~Importer_resolveUnitsImportFromFile_Test
          (Importer_resolveUnitsImportFromFile_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, resolveUnitsImportFromFile)
{
    libcellml::ParserPtr p = libcellml::Parser::create(false);
    libcellml::ModelPtr model = p->parseModel(fileContents("import_units_model.cellml"));
    auto importer = libcellml::Importer::create();

    EXPECT_EQ(size_t(0), p->issueCount());

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath());
    EXPECT_FALSE(model->hasUnresolvedImports());
}